

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHash.h
# Opt level: O2

int * Hash_Int2ManLookup(Hash_IntMan_t *p,int iData0,int iData1)

{
  int *piVar1;
  Hash_IntObj_t *pHVar2;
  
  piVar1 = Vec_IntEntryP(p->vTable,
                         (uint)(iData1 * 0x1ec1 + iData0 * 0x1051) % (uint)p->vTable->nSize);
  while( true ) {
    pHVar2 = Hash_IntObj(p,*piVar1);
    if (pHVar2 == (Hash_IntObj_t *)0x0) {
      if (*piVar1 == 0) {
        return piVar1;
      }
      __assert_fail("*pPlace == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHash.h"
                    ,0x9b,"int *Hash_Int2ManLookup(Hash_IntMan_t *, int, int)");
    }
    if ((pHVar2->iData0 == iData0) && (pHVar2->iData1 == iData1)) break;
    piVar1 = &pHVar2->iNext;
  }
  return piVar1;
}

Assistant:

static inline int * Hash_Int2ManLookup( Hash_IntMan_t * p, int iData0, int iData1 )
{
    Hash_IntObj_t * pObj;
    int * pPlace = Vec_IntEntryP( p->vTable, Hash_Int2ManHash(iData0, iData1, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hash_IntObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( pObj->iData0 == iData0 && pObj->iData1 == iData1 )
            return pPlace;
    assert( *pPlace == 0 );
    return pPlace;
}